

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void matrix_print(gf *a,int m,int n)

{
  int local_20;
  int local_1c;
  int col;
  int row;
  int n_local;
  int m_local;
  gf *a_local;
  
  for (local_1c = 0; local_1c < m; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
      fprintf(_stderr,"%-3u ",(ulong)a[local_1c * n + local_20]);
    }
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

void matrix_print(gf *a, int m, int n) {
  int row;
  for (row = 0; row < m; row++) {
    int col;
    for (col = 0; col < n; col++)
      fprintf(stderr, "%-3u ", a[row * n + col]);
    fprintf(stderr, "\n");
  }
}